

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

Matcher<double> * testing::A<double>(void)

{
  void *__s;
  Matcher<double> *in_RDI;
  MatcherInterface<double> *in_stack_ffffffffffffffd8;
  Matcher<double> *this;
  
  this = in_RDI;
  __s = operator_new(8);
  memset(__s,0,8);
  internal::AnyMatcherImpl<double>::AnyMatcherImpl((AnyMatcherImpl<double> *)this);
  MakeMatcher<double>(in_stack_ffffffffffffffd8);
  return in_RDI;
}

Assistant:

inline Matcher<T> A() { return MakeMatcher(new internal::AnyMatcherImpl<T>()); }